

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_componentWithImport_Test::~Clone_componentWithImport_Test
          (Clone_componentWithImport_Test *this)

{
  Clone_componentWithImport_Test *this_local;
  
  ~Clone_componentWithImport_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, componentWithImport)
{
    auto c = libcellml::Component::create();
    auto import = libcellml::ImportSource::create();
    import->setUrl("some-other-model.xml");

    c->setId("unique");
    c->setName("copy");
    c->setSourceComponent(import, "imported_component_name");

    auto cClone = c->clone();

    compareComponent(c, cClone);
}